

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_privileged_ports(session_impl *this)

{
  bool bVar1;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  shared_ptr<libtorrent::aux::torrent> *t;
  iterator __end3;
  iterator __begin3;
  torrent_list<libtorrent::aux::torrent> *__range3;
  session_impl *this_local;
  
  bVar1 = session_settings::get_bool(&this->m_settings,0x802b);
  if (bVar1) {
    __end3 = torrent_list<libtorrent::aux::torrent>::begin(&this->m_torrents);
    t = (shared_ptr<libtorrent::aux::torrent> *)
        torrent_list<libtorrent::aux::torrent>::end(&this->m_torrents);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                       *)&t), bVar1) {
      this_00 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                   ::operator*(&__end3);
      this_01 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_00);
      torrent::privileged_port_updated(this_01);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

void session_impl::update_privileged_ports()
	{
		if (m_settings.get_bool(settings_pack::no_connect_privileged_ports))
		{
			// Close connections whose endpoint is filtered
			// by the new setting
			for (auto const& t : m_torrents)
				t->privileged_port_updated();
		}
	}